

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void new_localvar(LexState *ls,TString *name)

{
  int iVar1;
  FuncState *fs_00;
  Dyndata *pDVar2;
  int iVar3;
  Vardesc *pVVar4;
  int reg;
  Dyndata *dyd;
  FuncState *fs;
  TString *name_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pDVar2 = ls->dyd;
  iVar3 = registerlocalvar(ls,name);
  checklimit(fs_00,((pDVar2->actvar).n + 1) - fs_00->firstlocal,200,"local variables");
  if ((pDVar2->actvar).size < (pDVar2->actvar).n + 2) {
    pVVar4 = (Vardesc *)
             luaM_growaux_(ls->L,(pDVar2->actvar).arr,&(pDVar2->actvar).size,2,0x7fffffff,
                           "local variables");
    (pDVar2->actvar).arr = pVVar4;
  }
  iVar1 = (pDVar2->actvar).n;
  (pDVar2->actvar).n = iVar1 + 1;
  (pDVar2->actvar).arr[iVar1].idx = (short)iVar3;
  return;
}

Assistant:

static int new_localvar (LexState *ls, TString *name) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  Vardesc *var;
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                 MAXVARS, "local variables");
  luaM_growvector(L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, USHRT_MAX, "local variables");
  var = &dyd->actvar.arr[dyd->actvar.n++];
  var->vd.kind = VDKREG;  /* default */
  var->vd.name = name;
  return dyd->actvar.n - 1 - fs->firstlocal;
}